

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::CompositeVisitor::update(CompositeVisitor *this)

{
  VisitorIterator *in_RDI;
  CompositeVisitor *unaff_retaddr;
  BaseVisitor *curVisitor;
  VisitorIterator i;
  BaseVisitor *local_18;
  _List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_> local_10;
  
  std::_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::_List_iterator(&local_10);
  local_18 = beginVisitor(unaff_retaddr,in_RDI);
  while (local_18 != (BaseVisitor *)0x0) {
    (*local_18->_vptr_BaseVisitor[9])();
    local_18 = nextVisitor(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void CompositeVisitor::update() {
    VisitorIterator i;
    BaseVisitor* curVisitor;

    for (curVisitor = beginVisitor(i); curVisitor; curVisitor = nextVisitor(i))
      curVisitor->update();
  }